

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-item-use.c
# Opt level: O0

_Bool borg_activate_item(int activation)

{
  borg_item_conflict *pbVar1;
  char *what;
  borg_item_conflict *item;
  int i;
  int activation_local;
  
  if (borg.activation[activation] != 0) {
    for (item._4_4_ = (uint)z_info->pack_size; (int)item._4_4_ < (int)(z_info->pack_size + 0xc);
        item._4_4_ = item._4_4_ + 1) {
      pbVar1 = borg_items + (int)item._4_4_;
      if (((pbVar1->iqty != '\0') && (pbVar1->activ_idx == activation)) && (pbVar1->timeout == 0)) {
        what = format("# Activating item %s.",pbVar1);
        borg_note(what);
        borg_keypress(0x41);
        borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"
                           [(int)(item._4_4_ - z_info->pack_size)]);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool borg_activate_item(int activation)
{
    int i;

    /* a quick check of the array */
    if (!borg.activation[activation])
        return false;

    /* Check the equipment */
    for (i = INVEN_WIELD; i < INVEN_TOTAL; i++) {
        borg_item *item = &borg_items[i];

        if (!item->iqty)
            continue;

        /* Skip wrong activation*/
        if (item->activ_idx != activation)
            continue;

        /* Check charge */
        if (item->timeout)
            continue;

        /* Log the message */
        borg_note(format("# Activating item %s.", item->desc));

        /* Perform the action */
        borg_keypress('A');
        borg_keypress(all_letters_nohjkl[i - INVEN_WIELD]);

        /* Success */
        return true;
    }

    /* Oops */
    return false;
}